

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::Extension::SerializeFieldWithCachedSizes
          (Extension *this,int number,CodedOutputStream *output)

{
  FieldType FVar1;
  byte *pbVar2;
  MessageLite *value;
  bool bVar3;
  LogMessage *pLVar4;
  Type *pTVar5;
  Type *pTVar6;
  int *piVar7;
  uint32 *puVar8;
  ulong *puVar9;
  uint64 *puVar10;
  bool *pbVar11;
  double *pdVar12;
  float *pfVar13;
  long *plVar14;
  uint *puVar15;
  unsigned_long *puVar16;
  int iVar17;
  int iVar18;
  byte *pbVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  string *psVar24;
  RepeatedField<unsigned_int> *pRVar25;
  RepeatedField<unsigned_long> *pRVar26;
  RepeatedField<bool> *pRVar27;
  RepeatedField<double> *pRVar28;
  RepeatedField<float> *pRVar29;
  RepeatedField<long> *pRVar30;
  RepeatedField<int> *pRVar31;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (this->is_repeated == true) {
    if (this->is_packed == true) {
      if (this->cached_size != 0) {
        uVar22 = number * 8 + 2;
        uVar23 = (ulong)uVar22;
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar22);
          iVar17 = output->buffer_size_;
        }
        else {
          pbVar2 = output->buffer_;
          pbVar19 = pbVar2;
          if (0x7f < (uint)(number << 3)) {
            do {
              uVar22 = (uint)uVar23;
              *pbVar19 = (byte)uVar23 | 0x80;
              uVar23 = uVar23 >> 7;
              pbVar19 = pbVar19 + 1;
            } while (0x3fff < uVar22);
          }
          *pbVar19 = (byte)uVar23;
          iVar17 = ((int)pbVar19 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar17;
          iVar17 = output->buffer_size_ - iVar17;
          output->buffer_size_ = iVar17;
        }
        uVar22 = this->cached_size;
        if (iVar17 < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar22);
        }
        else {
          pbVar2 = output->buffer_;
          pbVar19 = pbVar2;
          uVar20 = uVar22;
          if (0x7f < uVar22) {
            do {
              *pbVar19 = (byte)uVar22 | 0x80;
              uVar20 = uVar22 >> 7;
              pbVar19 = pbVar19 + 1;
              bVar3 = 0x3fff < uVar22;
              uVar22 = uVar20;
            } while (bVar3);
          }
          *pbVar19 = (byte)uVar20;
          iVar17 = ((int)pbVar19 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar17;
          output->buffer_size_ = output->buffer_size_ - iVar17;
        }
        FVar1 = this->type;
        if ((byte)(FVar1 - 0x13) < 0xee) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                     ,0x34);
          pLVar4 = LogMessage::operator<<
                             (&local_68,
                              "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
          LogFinisher::operator=(&local_69,pLVar4);
          LogMessage::~LogMessage(&local_68);
        }
        switch(FVar1) {
        case '\x01':
          pRVar28 = (this->field_0).repeated_double_value;
          if (0 < pRVar28->current_size_) {
            iVar17 = 0;
            do {
              pdVar12 = RepeatedField<double>::Get(pRVar28,iVar17);
              io::CodedOutputStream::WriteLittleEndian64(output,(uint64)*pdVar12);
              iVar17 = iVar17 + 1;
              pRVar28 = (this->field_0).repeated_double_value;
            } while (iVar17 < pRVar28->current_size_);
          }
          break;
        case '\x02':
          pRVar29 = (this->field_0).repeated_float_value;
          if (0 < pRVar29->current_size_) {
            iVar17 = 0;
            do {
              pfVar13 = RepeatedField<float>::Get(pRVar29,iVar17);
              io::CodedOutputStream::WriteLittleEndian32(output,(uint32)*pfVar13);
              iVar17 = iVar17 + 1;
              pRVar29 = (this->field_0).repeated_float_value;
            } while (iVar17 < pRVar29->current_size_);
          }
          break;
        case '\x03':
          pRVar30 = (this->field_0).repeated_int64_value;
          if (0 < pRVar30->current_size_) {
            iVar17 = 0;
            do {
              puVar9 = (ulong *)RepeatedField<long>::Get(pRVar30,iVar17);
              uVar23 = *puVar9;
              if (output->buffer_size_ < 10) {
                io::CodedOutputStream::WriteVarint64SlowPath(output,uVar23);
              }
              else {
                pbVar2 = output->buffer_;
                pbVar19 = pbVar2;
                uVar21 = uVar23;
                if (0x7f < uVar23) {
                  do {
                    *pbVar19 = (byte)uVar23 | 0x80;
                    uVar21 = uVar23 >> 7;
                    pbVar19 = pbVar19 + 1;
                    bVar3 = 0x3fff < uVar23;
                    uVar23 = uVar21;
                  } while (bVar3);
                }
                *pbVar19 = (byte)uVar21;
                iVar18 = ((int)pbVar19 - (int)pbVar2) + 1;
                output->buffer_ = output->buffer_ + iVar18;
                output->buffer_size_ = output->buffer_size_ - iVar18;
              }
              iVar17 = iVar17 + 1;
              pRVar30 = (this->field_0).repeated_int64_value;
            } while (iVar17 < pRVar30->current_size_);
          }
          break;
        case '\x04':
          pRVar26 = (this->field_0).repeated_uint64_value;
          if (0 < pRVar26->current_size_) {
            iVar17 = 0;
            do {
              puVar16 = RepeatedField<unsigned_long>::Get(pRVar26,iVar17);
              uVar23 = *puVar16;
              if (output->buffer_size_ < 10) {
                io::CodedOutputStream::WriteVarint64SlowPath(output,uVar23);
              }
              else {
                pbVar2 = output->buffer_;
                pbVar19 = pbVar2;
                uVar21 = uVar23;
                if (0x7f < uVar23) {
                  do {
                    *pbVar19 = (byte)uVar23 | 0x80;
                    uVar21 = uVar23 >> 7;
                    pbVar19 = pbVar19 + 1;
                    bVar3 = 0x3fff < uVar23;
                    uVar23 = uVar21;
                  } while (bVar3);
                }
                *pbVar19 = (byte)uVar21;
                iVar18 = ((int)pbVar19 - (int)pbVar2) + 1;
                output->buffer_ = output->buffer_ + iVar18;
                output->buffer_size_ = output->buffer_size_ - iVar18;
              }
              iVar17 = iVar17 + 1;
              pRVar26 = (this->field_0).repeated_uint64_value;
            } while (iVar17 < pRVar26->current_size_);
          }
          break;
        case '\x05':
          pRVar31 = (this->field_0).repeated_int32_value;
          if (0 < pRVar31->current_size_) {
            iVar17 = 0;
            do {
              puVar15 = (uint *)RepeatedField<int>::Get(pRVar31,iVar17);
              uVar23 = (ulong)(int)*puVar15;
              if (output->buffer_size_ < 10) {
                io::CodedOutputStream::WriteVarint64SlowPath(output,uVar23);
              }
              else {
                pbVar2 = output->buffer_;
                pbVar19 = pbVar2;
                uVar21 = uVar23;
                if (0x7f < *puVar15) {
                  do {
                    *pbVar19 = (byte)uVar21 | 0x80;
                    uVar23 = uVar21 >> 7;
                    pbVar19 = pbVar19 + 1;
                    bVar3 = 0x3fff < uVar21;
                    uVar21 = uVar23;
                  } while (bVar3);
                }
                *pbVar19 = (byte)uVar23;
                iVar18 = ((int)pbVar19 - (int)pbVar2) + 1;
                output->buffer_ = output->buffer_ + iVar18;
                output->buffer_size_ = output->buffer_size_ - iVar18;
              }
              iVar17 = iVar17 + 1;
              pRVar31 = (this->field_0).repeated_int32_value;
            } while (iVar17 < pRVar31->current_size_);
          }
          break;
        case '\x06':
          pRVar26 = (this->field_0).repeated_uint64_value;
          if (0 < pRVar26->current_size_) {
            iVar17 = 0;
            do {
              puVar16 = RepeatedField<unsigned_long>::Get(pRVar26,iVar17);
              io::CodedOutputStream::WriteLittleEndian64(output,*puVar16);
              iVar17 = iVar17 + 1;
              pRVar26 = (this->field_0).repeated_uint64_value;
            } while (iVar17 < pRVar26->current_size_);
          }
          break;
        case '\a':
          pRVar25 = (this->field_0).repeated_uint32_value;
          if (0 < pRVar25->current_size_) {
            iVar17 = 0;
            do {
              puVar15 = RepeatedField<unsigned_int>::Get(pRVar25,iVar17);
              io::CodedOutputStream::WriteLittleEndian32(output,*puVar15);
              iVar17 = iVar17 + 1;
              pRVar25 = (this->field_0).repeated_uint32_value;
            } while (iVar17 < pRVar25->current_size_);
          }
          break;
        case '\b':
          pRVar27 = (this->field_0).repeated_bool_value;
          if (0 < pRVar27->current_size_) {
            iVar17 = 0;
            do {
              pbVar11 = RepeatedField<bool>::Get(pRVar27,iVar17);
              if (output->buffer_size_ < 5) {
                io::CodedOutputStream::WriteVarint32SlowPath(output,(uint)*pbVar11);
              }
              else {
                *output->buffer_ = *pbVar11;
                output->buffer_ = output->buffer_ + 1;
                output->buffer_size_ = output->buffer_size_ + -1;
              }
              iVar17 = iVar17 + 1;
              pRVar27 = (this->field_0).repeated_bool_value;
            } while (iVar17 < pRVar27->current_size_);
          }
          break;
        case '\t':
        case '\n':
        case '\v':
        case '\f':
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                     ,0x5bd);
          pLVar4 = LogMessage::operator<<(&local_68,"Non-primitive types can\'t be packed.");
          LogFinisher::operator=(&local_69,pLVar4);
          LogMessage::~LogMessage(&local_68);
          break;
        case '\r':
          pRVar25 = (this->field_0).repeated_uint32_value;
          if (0 < pRVar25->current_size_) {
            iVar17 = 0;
            do {
              puVar15 = RepeatedField<unsigned_int>::Get(pRVar25,iVar17);
              uVar22 = *puVar15;
              if (output->buffer_size_ < 5) {
                io::CodedOutputStream::WriteVarint32SlowPath(output,uVar22);
              }
              else {
                pbVar2 = output->buffer_;
                pbVar19 = pbVar2;
                uVar20 = uVar22;
                if (0x7f < uVar22) {
                  do {
                    *pbVar19 = (byte)uVar22 | 0x80;
                    uVar20 = uVar22 >> 7;
                    pbVar19 = pbVar19 + 1;
                    bVar3 = 0x3fff < uVar22;
                    uVar22 = uVar20;
                  } while (bVar3);
                }
                *pbVar19 = (byte)uVar20;
                iVar18 = ((int)pbVar19 - (int)pbVar2) + 1;
                output->buffer_ = output->buffer_ + iVar18;
                output->buffer_size_ = output->buffer_size_ - iVar18;
              }
              iVar17 = iVar17 + 1;
              pRVar25 = (this->field_0).repeated_uint32_value;
            } while (iVar17 < pRVar25->current_size_);
          }
          break;
        case '\x0e':
          pRVar31 = (this->field_0).repeated_int32_value;
          if (0 < pRVar31->current_size_) {
            iVar17 = 0;
            do {
              puVar15 = (uint *)RepeatedField<int>::Get(pRVar31,iVar17);
              uVar23 = (ulong)(int)*puVar15;
              if (output->buffer_size_ < 10) {
                io::CodedOutputStream::WriteVarint64SlowPath(output,uVar23);
              }
              else {
                pbVar2 = output->buffer_;
                pbVar19 = pbVar2;
                uVar21 = uVar23;
                if (0x7f < *puVar15) {
                  do {
                    *pbVar19 = (byte)uVar21 | 0x80;
                    uVar23 = uVar21 >> 7;
                    pbVar19 = pbVar19 + 1;
                    bVar3 = 0x3fff < uVar21;
                    uVar21 = uVar23;
                  } while (bVar3);
                }
                *pbVar19 = (byte)uVar23;
                iVar18 = ((int)pbVar19 - (int)pbVar2) + 1;
                output->buffer_ = output->buffer_ + iVar18;
                output->buffer_size_ = output->buffer_size_ - iVar18;
              }
              iVar17 = iVar17 + 1;
              pRVar31 = (this->field_0).repeated_int32_value;
            } while (iVar17 < pRVar31->current_size_);
          }
          break;
        case '\x0f':
          pRVar31 = (this->field_0).repeated_int32_value;
          if (0 < pRVar31->current_size_) {
            iVar17 = 0;
            do {
              puVar8 = (uint32 *)RepeatedField<int>::Get(pRVar31,iVar17);
              io::CodedOutputStream::WriteLittleEndian32(output,*puVar8);
              iVar17 = iVar17 + 1;
              pRVar31 = (this->field_0).repeated_int32_value;
            } while (iVar17 < pRVar31->current_size_);
          }
          break;
        case '\x10':
          pRVar30 = (this->field_0).repeated_int64_value;
          if (0 < pRVar30->current_size_) {
            iVar17 = 0;
            do {
              puVar10 = (uint64 *)RepeatedField<long>::Get(pRVar30,iVar17);
              io::CodedOutputStream::WriteLittleEndian64(output,*puVar10);
              iVar17 = iVar17 + 1;
              pRVar30 = (this->field_0).repeated_int64_value;
            } while (iVar17 < pRVar30->current_size_);
          }
          break;
        case '\x11':
          pRVar31 = (this->field_0).repeated_int32_value;
          if (0 < pRVar31->current_size_) {
            iVar17 = 0;
            do {
              piVar7 = RepeatedField<int>::Get(pRVar31,iVar17);
              uVar22 = *piVar7 >> 0x1f ^ *piVar7 * 2;
              if (output->buffer_size_ < 5) {
                io::CodedOutputStream::WriteVarint32SlowPath(output,uVar22);
              }
              else {
                pbVar2 = output->buffer_;
                pbVar19 = pbVar2;
                uVar20 = uVar22;
                if (0x7f < uVar22) {
                  do {
                    *pbVar19 = (byte)uVar22 | 0x80;
                    uVar20 = uVar22 >> 7;
                    pbVar19 = pbVar19 + 1;
                    bVar3 = 0x3fff < uVar22;
                    uVar22 = uVar20;
                  } while (bVar3);
                }
                *pbVar19 = (byte)uVar20;
                iVar18 = ((int)pbVar19 - (int)pbVar2) + 1;
                output->buffer_ = output->buffer_ + iVar18;
                output->buffer_size_ = output->buffer_size_ - iVar18;
              }
              iVar17 = iVar17 + 1;
              pRVar31 = (this->field_0).repeated_int32_value;
            } while (iVar17 < pRVar31->current_size_);
          }
          break;
        case '\x12':
          pRVar30 = (this->field_0).repeated_int64_value;
          if (0 < pRVar30->current_size_) {
            iVar17 = 0;
            do {
              plVar14 = RepeatedField<long>::Get(pRVar30,iVar17);
              uVar23 = *plVar14 >> 0x3f ^ *plVar14 * 2;
              if (output->buffer_size_ < 10) {
                io::CodedOutputStream::WriteVarint64SlowPath(output,uVar23);
              }
              else {
                pbVar2 = output->buffer_;
                pbVar19 = pbVar2;
                uVar21 = uVar23;
                if (0x7f < uVar23) {
                  do {
                    *pbVar19 = (byte)uVar21 | 0x80;
                    uVar23 = uVar21 >> 7;
                    pbVar19 = pbVar19 + 1;
                    bVar3 = 0x3fff < uVar21;
                    uVar21 = uVar23;
                  } while (bVar3);
                }
                *pbVar19 = (byte)uVar23;
                iVar18 = ((int)pbVar19 - (int)pbVar2) + 1;
                output->buffer_ = output->buffer_ + iVar18;
                output->buffer_size_ = output->buffer_size_ - iVar18;
              }
              iVar17 = iVar17 + 1;
              pRVar30 = (this->field_0).repeated_int64_value;
            } while (iVar17 < pRVar30->current_size_);
          }
        }
      }
    }
    else {
      FVar1 = this->type;
      if ((byte)(FVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x34);
        pLVar4 = LogMessage::operator<<
                           (&local_68,
                            "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_69,pLVar4);
        LogMessage::~LogMessage(&local_68);
      }
      switch(FVar1) {
      case '\x01':
        pRVar28 = (this->field_0).repeated_double_value;
        if (0 < pRVar28->current_size_) {
          iVar17 = 0;
          do {
            pdVar12 = RepeatedField<double>::Get(pRVar28,iVar17);
            WireFormatLite::WriteDouble(number,*pdVar12,output);
            iVar17 = iVar17 + 1;
            pRVar28 = (this->field_0).repeated_double_value;
          } while (iVar17 < pRVar28->current_size_);
        }
        break;
      case '\x02':
        pRVar29 = (this->field_0).repeated_float_value;
        if (0 < pRVar29->current_size_) {
          iVar17 = 0;
          do {
            pfVar13 = RepeatedField<float>::Get(pRVar29,iVar17);
            WireFormatLite::WriteFloat(number,*pfVar13,output);
            iVar17 = iVar17 + 1;
            pRVar29 = (this->field_0).repeated_float_value;
          } while (iVar17 < pRVar29->current_size_);
        }
        break;
      case '\x03':
        pRVar30 = (this->field_0).repeated_int64_value;
        if (0 < pRVar30->current_size_) {
          iVar17 = 0;
          do {
            plVar14 = RepeatedField<long>::Get(pRVar30,iVar17);
            WireFormatLite::WriteInt64(number,*plVar14,output);
            iVar17 = iVar17 + 1;
            pRVar30 = (this->field_0).repeated_int64_value;
          } while (iVar17 < pRVar30->current_size_);
        }
        break;
      case '\x04':
        pRVar26 = (this->field_0).repeated_uint64_value;
        if (0 < pRVar26->current_size_) {
          iVar17 = 0;
          do {
            puVar16 = RepeatedField<unsigned_long>::Get(pRVar26,iVar17);
            WireFormatLite::WriteUInt64(number,*puVar16,output);
            iVar17 = iVar17 + 1;
            pRVar26 = (this->field_0).repeated_uint64_value;
          } while (iVar17 < pRVar26->current_size_);
        }
        break;
      case '\x05':
        pRVar31 = (this->field_0).repeated_int32_value;
        if (0 < pRVar31->current_size_) {
          iVar17 = 0;
          do {
            piVar7 = RepeatedField<int>::Get(pRVar31,iVar17);
            WireFormatLite::WriteInt32(number,*piVar7,output);
            iVar17 = iVar17 + 1;
            pRVar31 = (this->field_0).repeated_int32_value;
          } while (iVar17 < pRVar31->current_size_);
        }
        break;
      case '\x06':
        pRVar26 = (this->field_0).repeated_uint64_value;
        if (0 < pRVar26->current_size_) {
          iVar17 = 0;
          do {
            puVar16 = RepeatedField<unsigned_long>::Get(pRVar26,iVar17);
            WireFormatLite::WriteFixed64(number,*puVar16,output);
            iVar17 = iVar17 + 1;
            pRVar26 = (this->field_0).repeated_uint64_value;
          } while (iVar17 < pRVar26->current_size_);
        }
        break;
      case '\a':
        pRVar25 = (this->field_0).repeated_uint32_value;
        if (0 < pRVar25->current_size_) {
          iVar17 = 0;
          do {
            puVar15 = RepeatedField<unsigned_int>::Get(pRVar25,iVar17);
            WireFormatLite::WriteFixed32(number,*puVar15,output);
            iVar17 = iVar17 + 1;
            pRVar25 = (this->field_0).repeated_uint32_value;
          } while (iVar17 < pRVar25->current_size_);
        }
        break;
      case '\b':
        pRVar27 = (this->field_0).repeated_bool_value;
        if (0 < pRVar27->current_size_) {
          iVar17 = 0;
          do {
            pbVar11 = RepeatedField<bool>::Get(pRVar27,iVar17);
            WireFormatLite::WriteBool(number,*pbVar11,output);
            iVar17 = iVar17 + 1;
            pRVar27 = (this->field_0).repeated_bool_value;
          } while (iVar17 < pRVar27->current_size_);
        }
        break;
      case '\t':
        psVar24 = (this->field_0).string_value;
        if (0 < (int)psVar24->_M_string_length) {
          iVar17 = 0;
          do {
            pTVar5 = RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               ((RepeatedPtrFieldBase *)psVar24,iVar17);
            WireFormatLite::WriteString(number,pTVar5,output);
            iVar17 = iVar17 + 1;
            psVar24 = (this->field_0).string_value;
          } while (iVar17 < (int)psVar24->_M_string_length);
        }
        break;
      case '\n':
        psVar24 = (this->field_0).string_value;
        if (0 < (int)psVar24->_M_string_length) {
          iVar17 = 0;
          do {
            pTVar6 = RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                               ((RepeatedPtrFieldBase *)psVar24,iVar17);
            WireFormatLite::WriteGroup(number,pTVar6,output);
            iVar17 = iVar17 + 1;
            psVar24 = (this->field_0).string_value;
          } while (iVar17 < (int)psVar24->_M_string_length);
        }
        break;
      case '\v':
        psVar24 = (this->field_0).string_value;
        if (0 < (int)psVar24->_M_string_length) {
          iVar17 = 0;
          do {
            pTVar6 = RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                               ((RepeatedPtrFieldBase *)psVar24,iVar17);
            WireFormatLite::WriteMessage(number,pTVar6,output);
            iVar17 = iVar17 + 1;
            psVar24 = (this->field_0).string_value;
          } while (iVar17 < (int)psVar24->_M_string_length);
        }
        break;
      case '\f':
        psVar24 = (this->field_0).string_value;
        if (0 < (int)psVar24->_M_string_length) {
          iVar17 = 0;
          do {
            pTVar5 = RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               ((RepeatedPtrFieldBase *)psVar24,iVar17);
            WireFormatLite::WriteBytes(number,pTVar5,output);
            iVar17 = iVar17 + 1;
            psVar24 = (this->field_0).string_value;
          } while (iVar17 < (int)psVar24->_M_string_length);
        }
        break;
      case '\r':
        pRVar25 = (this->field_0).repeated_uint32_value;
        if (0 < pRVar25->current_size_) {
          iVar17 = 0;
          do {
            puVar15 = RepeatedField<unsigned_int>::Get(pRVar25,iVar17);
            WireFormatLite::WriteUInt32(number,*puVar15,output);
            iVar17 = iVar17 + 1;
            pRVar25 = (this->field_0).repeated_uint32_value;
          } while (iVar17 < pRVar25->current_size_);
        }
        break;
      case '\x0e':
        pRVar31 = (this->field_0).repeated_int32_value;
        if (0 < pRVar31->current_size_) {
          iVar17 = 0;
          do {
            piVar7 = RepeatedField<int>::Get(pRVar31,iVar17);
            WireFormatLite::WriteEnum(number,*piVar7,output);
            iVar17 = iVar17 + 1;
            pRVar31 = (this->field_0).repeated_int32_value;
          } while (iVar17 < pRVar31->current_size_);
        }
        break;
      case '\x0f':
        pRVar31 = (this->field_0).repeated_int32_value;
        if (0 < pRVar31->current_size_) {
          iVar17 = 0;
          do {
            piVar7 = RepeatedField<int>::Get(pRVar31,iVar17);
            WireFormatLite::WriteSFixed32(number,*piVar7,output);
            iVar17 = iVar17 + 1;
            pRVar31 = (this->field_0).repeated_int32_value;
          } while (iVar17 < pRVar31->current_size_);
        }
        break;
      case '\x10':
        pRVar30 = (this->field_0).repeated_int64_value;
        if (0 < pRVar30->current_size_) {
          iVar17 = 0;
          do {
            plVar14 = RepeatedField<long>::Get(pRVar30,iVar17);
            WireFormatLite::WriteSFixed64(number,*plVar14,output);
            iVar17 = iVar17 + 1;
            pRVar30 = (this->field_0).repeated_int64_value;
          } while (iVar17 < pRVar30->current_size_);
        }
        break;
      case '\x11':
        pRVar31 = (this->field_0).repeated_int32_value;
        if (0 < pRVar31->current_size_) {
          iVar17 = 0;
          do {
            piVar7 = RepeatedField<int>::Get(pRVar31,iVar17);
            WireFormatLite::WriteSInt32(number,*piVar7,output);
            iVar17 = iVar17 + 1;
            pRVar31 = (this->field_0).repeated_int32_value;
          } while (iVar17 < pRVar31->current_size_);
        }
        break;
      case '\x12':
        pRVar30 = (this->field_0).repeated_int64_value;
        if (0 < pRVar30->current_size_) {
          iVar17 = 0;
          do {
            plVar14 = RepeatedField<long>::Get(pRVar30,iVar17);
            WireFormatLite::WriteSInt64(number,*plVar14,output);
            iVar17 = iVar17 + 1;
            pRVar30 = (this->field_0).repeated_int64_value;
          } while (iVar17 < pRVar30->current_size_);
        }
      }
    }
  }
  else if ((this->field_0xa & 1) == 0) {
    FVar1 = this->type;
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    switch(FVar1) {
    case '\x01':
      WireFormatLite::WriteDouble(number,(this->field_0).double_value,output);
      break;
    case '\x02':
      WireFormatLite::WriteFloat(number,(this->field_0).float_value,output);
      break;
    case '\x03':
      WireFormatLite::WriteInt64(number,(this->field_0).int64_value,output);
      break;
    case '\x04':
      WireFormatLite::WriteUInt64(number,(this->field_0).uint64_value,output);
      break;
    case '\x05':
      WireFormatLite::WriteInt32(number,(this->field_0).int32_value,output);
      break;
    case '\x06':
      WireFormatLite::WriteFixed64(number,(this->field_0).uint64_value,output);
      break;
    case '\a':
      WireFormatLite::WriteFixed32(number,(this->field_0).uint32_value,output);
      break;
    case '\b':
      WireFormatLite::WriteBool(number,(this->field_0).bool_value,output);
      break;
    case '\t':
      WireFormatLite::WriteString(number,(this->field_0).string_value,output);
      break;
    case '\n':
      WireFormatLite::WriteGroup(number,(this->field_0).message_value,output);
      break;
    case '\v':
      value = (this->field_0).message_value;
      if ((this->field_0xa & 0x10) == 0) {
        WireFormatLite::WriteMessage(number,value,output);
      }
      else {
        (*value->_vptr_MessageLite[0xf])(value,(ulong)(uint)number,output);
      }
      break;
    case '\f':
      WireFormatLite::WriteBytes(number,(this->field_0).string_value,output);
      break;
    case '\r':
      WireFormatLite::WriteUInt32(number,(this->field_0).uint32_value,output);
      break;
    case '\x0e':
      WireFormatLite::WriteEnum(number,(this->field_0).enum_value,output);
      break;
    case '\x0f':
      WireFormatLite::WriteSFixed32(number,(this->field_0).int32_value,output);
      break;
    case '\x10':
      WireFormatLite::WriteSFixed64(number,(this->field_0).int64_value,output);
      break;
    case '\x11':
      WireFormatLite::WriteSInt32(number,(this->field_0).int32_value,output);
      break;
    case '\x12':
      WireFormatLite::WriteSInt64(number,(this->field_0).int64_value,output);
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::SerializeFieldWithCachedSizes(
    int number,
    io::CodedOutputStream* output) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return;

      WireFormatLite::WriteTag(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
      output->WriteVarint32(cached_size);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE##NoTag(                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE(number,                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case WireFormatLite::TYPE_##UPPERCASE:                     \
        WireFormatLite::Write##CAMELCASE(number, VALUE, output); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          lazymessage_value->WriteMessage(number, output);
        } else {
          WireFormatLite::WriteMessage(number, *message_value, output);
        }
        break;
    }
  }
}